

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O1

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readGenericPlotfileHeader
          (PltFileManager *this,string *a_pltFileHeader)

{
  Box *pBVar1;
  double dVar2;
  Box *pBVar3;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pVVar4;
  char cVar5;
  istream *piVar6;
  int *piVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  size_type __new_size;
  long lVar11;
  Box **ppBVar12;
  double *pdVar13;
  string line;
  string word;
  int coord_sys;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> Domains;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  int PLT_SPACEDIM;
  string fileCharPtrString;
  Real prob_hi [3];
  Real prob_lo [3];
  Array<int,_3> perio;
  istringstream is;
  istringstream lis;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  Box *local_450;
  undefined8 local_448;
  undefined1 local_440 [32];
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_420;
  IntVect local_404;
  Vector<char,_std::allocator<char>_> local_3f8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_3e0;
  int *local_3d8;
  int local_3cc;
  RealBox local_3c8;
  long *local_398 [2];
  long local_388 [2];
  Real local_378 [4];
  Box *local_358;
  Real RStack_350;
  Real local_348;
  Array<int,_3> local_340;
  undefined8 local_330;
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_3f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (char *)0x0;
  local_3f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_3f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_330._0_4_ = amrex::ParallelDescriptor::m_comm;
  amrex::ParallelDescriptor::ReadAndBcastFile
            (a_pltFileHeader,&local_3f8,true,(MPI_Comm *)&local_330);
  std::__cxx11::string::string
            ((string *)local_398,
             local_3f8.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&local_330);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_330,(string *)local_398,_S_in);
  local_470 = &local_460;
  local_468 = 0;
  local_460 = 0;
  local_450 = (Box *)local_440;
  local_448 = 0;
  local_440[0] = 0;
  cVar5 = std::ios::widen((char)(istringstream *)&local_330 +
                          (char)*(undefined8 *)
                                 (CONCAT44(local_330._4_4_,(MPI_Comm)local_330) + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_330,(string *)&local_470,cVar5);
  piVar7 = &this->m_nvars;
  this->m_nvars = 0;
  std::istream::operator>>((istream *)&local_330,piVar7);
  std::istream::ignore((long)&local_330,100000);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&(this->m_vars).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,(long)this->m_nvars);
  if (0 < *piVar7) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      std::operator>>((istream *)&local_330,
                      (string *)
                      ((long)&(((this->m_vars).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar10));
      std::istream::ignore((long)&local_330,100000);
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar11 < *piVar7);
  }
  local_3cc = 3;
  std::istream::operator>>((istream *)&local_330,&local_3cc);
  std::istream::ignore((long)&local_330,100000);
  std::istream::_M_extract<double>((double *)&local_330);
  std::istream::ignore((long)&local_330,100000);
  std::istream::operator>>((istream *)&local_330,&this->m_nlevels);
  std::istream::ignore((long)&local_330,100000);
  __new_size = (long)this->m_nlevels + 1;
  this->m_nlevels = (int)__new_size;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->m_grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             __new_size);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            (&(this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             (long)this->m_nlevels);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_refRatio).super_vector<int,_std::allocator<int>_>,(long)this->m_nlevels - 1);
  local_440._24_8_ = &this->m_refRatio;
  local_3e0 = &this->m_geoms;
  local_3d8 = &this->m_nlevels;
  cVar5 = std::ios::widen((char)&local_330 +
                          (char)*(undefined8 *)
                                 (CONCAT44(local_330._4_4_,(MPI_Comm)local_330) + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_330,(string *)&local_470,cVar5);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_470,_S_in);
  ppBVar12 = &local_358;
  while (piVar6 = std::operator>>((istream *)local_1b0,(string *)&local_450), pBVar3 = local_450,
        ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    piVar7 = __errno_location();
    iVar9 = *piVar7;
    *piVar7 = 0;
    pBVar1 = (Box *)strtod((char *)pBVar3,(char **)&local_3c8);
    if ((Box *)local_3c8.xlo[0] == pBVar3) {
      std::__throw_invalid_argument("stod");
      goto LAB_004c7214;
    }
    if (*piVar7 == 0) {
      *piVar7 = iVar9;
    }
    else if (*piVar7 == 0x22) goto LAB_004c7238;
    *ppBVar12 = pBVar1;
    ppBVar12 = ppBVar12 + 1;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  cVar5 = std::ios::widen((char)&local_330 +
                          (char)*(undefined8 *)
                                 (CONCAT44(local_330._4_4_,(MPI_Comm)local_330) + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_330,(string *)&local_470,cVar5);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_470,_S_in);
  pdVar13 = local_378;
  while (piVar6 = std::operator>>((istream *)local_1b0,(string *)&local_450), pBVar3 = local_450,
        ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    piVar7 = __errno_location();
    iVar9 = *piVar7;
    *piVar7 = 0;
    dVar2 = strtod((char *)pBVar3,(char **)&local_3c8);
    if ((Box *)local_3c8.xlo[0] == pBVar3) goto LAB_004c7214;
    if (*piVar7 == 0) {
      *piVar7 = iVar9;
    }
    else if (*piVar7 == 0x22) goto LAB_004c7244;
    *pdVar13 = dVar2;
    pdVar13 = pdVar13 + 1;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_3c8.xlo[0] = (Real)local_358;
  local_3c8.xlo[1] = RStack_350;
  local_3c8.xlo[2] = local_348;
  local_3c8.xhi[0] = local_378[0];
  local_3c8.xhi[1] = local_378[1];
  local_3c8.xhi[2] = local_378[2];
  cVar5 = std::ios::widen((char)&local_330 +
                          (char)*(undefined8 *)
                                 (CONCAT44(local_330._4_4_,(MPI_Comm)local_330) + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_330,(string *)&local_470,cVar5);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_470,_S_in);
  lVar10 = 0;
  while( true ) {
    uVar8 = local_440._24_8_;
    piVar6 = std::operator>>((istream *)local_1b0,(string *)&local_450);
    pBVar3 = local_450;
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      piVar7 = local_3d8;
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
                (&local_420,(long)*local_3d8,(allocator_type *)local_1b0);
      if (0 < *piVar7) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          amrex::operator>>((istream *)&local_330,
                            (Box *)((long)((local_420.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->smallend).
                                          vect + lVar10));
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x1c;
        } while (lVar11 < *piVar7);
      }
      std::istream::ignore((long)&local_330,100000);
      std::istream::ignore((long)&local_330,100000);
      if (0 < *piVar7) {
        iVar9 = 0;
        do {
          std::istream::ignore((long)&local_330,100000);
          iVar9 = iVar9 + 1;
        } while (iVar9 < *piVar7);
      }
      local_440._20_4_ = 0;
      std::istream::operator>>((istream *)&local_330,(int *)(local_440 + 0x14));
      std::istream::ignore((long)&local_330,100000);
      local_340._M_elems[2] = 0;
      local_340._M_elems[0] = 0;
      local_340._M_elems[1] = 0;
      amrex::Geometry::Geometry
                ((Geometry *)local_1b0,
                 local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_3c8,local_440._20_4_,&local_340);
      pVVar4 = local_3e0;
      memcpy((local_3e0->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start,(Geometry *)local_1b0,200);
      if (1 < *piVar7) {
        lVar11 = 1;
        lVar10 = 0;
        do {
          local_404.vect[0] =
               (((vector<int,_std::allocator<int>_> *)uVar8)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start[lVar11 + -1];
          local_404.vect[1] = local_404.vect[0];
          local_404.vect[2] = local_404.vect[0];
          memcpy((Geometry *)local_1b0,
                 (void *)((long)(((pVVar4->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar10 + 0xfffffffffffffff8U),200);
          amrex::Geometry::refine((Geometry *)local_1b0,&local_404);
          memcpy((void *)((long)(pVVar4->
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].super_CoordSys.offset +
                         lVar10 + 0xfffffffffffffff8U),(Geometry *)local_1b0,200);
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 200;
        } while (lVar11 < *piVar7);
      }
      if (local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start != (Box *)0x0) {
        operator_delete(local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_450 != (Box *)local_440) {
        operator_delete(local_450,CONCAT71(local_440._1_7_,local_440[0]) + 1);
      }
      if (local_470 != &local_460) {
        operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_330);
      std::ios_base::~ios_base(local_2b8);
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      if (local_3f8.super_vector<char,_std::allocator<char>_>.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
          != (char *)0x0) {
        operator_delete(local_3f8.super_vector<char,_std::allocator<char>_>.
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3f8.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3f8.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    piVar7 = __errno_location();
    iVar9 = *piVar7;
    *piVar7 = 0;
    lVar11 = strtol((char *)pBVar3,(char **)&local_420,10);
    if (local_420.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start == pBVar3) break;
    if (((int)lVar11 != lVar11) || (*piVar7 == 0x22)) goto LAB_004c722c;
    if (*piVar7 == 0) {
      *piVar7 = iVar9;
    }
    *(int *)((long)(((vector<int,_std::allocator<int>_> *)local_440._24_8_)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_start + lVar10) = (int)lVar11;
    lVar10 = lVar10 + 4;
  }
LAB_004c7220:
  std::__throw_invalid_argument("stoi");
LAB_004c722c:
  std::__throw_out_of_range("stoi");
LAB_004c7238:
  std::__throw_out_of_range("stod");
LAB_004c7244:
  uVar8 = std::__throw_out_of_range("stod");
  if (local_450 != (Box *)local_440) {
    operator_delete(local_450,CONCAT71(local_440._1_7_,local_440[0]) + 1);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_330);
  std::ios_base::~ios_base(local_2b8);
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_3f8.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (char *)0x0) {
    operator_delete(local_3f8.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_3f8.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_3f8.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar8);
LAB_004c7214:
  std::__throw_invalid_argument("stod");
  goto LAB_004c7220;
}

Assistant:

void
PltFileManager::readGenericPlotfileHeader(const std::string& a_pltFileHeader)
{
  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(a_pltFileHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line, word;

  // Title line
  std::getline(is, line);

  // Number of variables
  m_nvars = 0;
  is >> m_nvars;
  GotoNextLine(is);

  // Extract variables names
  m_vars.resize(m_nvars);
  for (int n = 0; n < m_nvars; n++) {
    is >> m_vars[n];
    GotoNextLine(is);
  }

  // Get and check space dimension
  int PLT_SPACEDIM = AMREX_SPACEDIM;
  is >> PLT_SPACEDIM;
  GotoNextLine(is);
  AMREX_ASSERT(PLT_SPACEDIM == AMREX_SPACEDIM);

  // Simulation time
  is >> m_time;
  GotoNextLine(is);

  // Number of levels
  is >> m_nlevels;
  GotoNextLine(is);
  m_nlevels += 1; // Finest is stored, need to add 1

  // Setup data holders
  m_grids.resize(m_nlevels);
  m_geoms.resize(m_nlevels);
  m_refRatio.resize(m_nlevels - 1);

  // Level 0 geometry
  Real prob_lo[AMREX_SPACEDIM];
  Real prob_hi[AMREX_SPACEDIM];
  // Low coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_lo[i++] = std::stod(word);
    }
  }

  // High coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_hi[i++] = std::stod(word);
    }
  }

  // Set up PltFile domain real box
  RealBox rb(prob_lo, prob_hi);

  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      m_refRatio[i++] = std::stoi(word);
    }
  }

  // Get levels Domains
  Vector<Box> Domains(m_nlevels);
  for (int lev = 0; lev < m_nlevels; ++lev) {
    is >> Domains[lev];
  }
  GotoNextLine(is);
  GotoNextLine(is); // Skip nsteps line
  for (int lev = 0; lev < m_nlevels; ++lev) {
    GotoNextLine(is); // Skip dx line
  }

  // Coordinate system
  int coord_sys = 0;
  is >> coord_sys;
  GotoNextLine(is);

  // Populate the geometry vector, assume no periodicity
  Array<int, AMREX_SPACEDIM> perio({AMREX_D_DECL(0, 0, 0)});
  m_geoms[0] = Geometry(Domains[0], rb, coord_sys, perio);
  for (int lev = 1; lev < m_nlevels; ++lev) {
    m_geoms[lev] = refine(m_geoms[lev - 1], m_refRatio[lev - 1]);
  }
}